

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::FieldDescriptorProto::ByteSizeLong(FieldDescriptorProto *this)

{
  byte bVar1;
  void *pvVar2;
  size_type sVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    sVar9 = 0;
  }
  else {
    sVar9 = internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  bVar1 = (byte)(this->_has_bits_).has_bits_[0];
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      sVar3 = ((this->name_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar9 = sVar9 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((bVar1 & 2) != 0) {
      sVar3 = ((this->extendee_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar9 = sVar9 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((bVar1 & 4) != 0) {
      sVar3 = ((this->type_name_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar9 = sVar9 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((bVar1 & 8) != 0) {
      sVar3 = ((this->default_value_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar9 = sVar9 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((bVar1 & 0x10) != 0) {
      sVar3 = ((this->json_name_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar9 = sVar9 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((bVar1 & 0x20) != 0) {
      sVar5 = FieldOptions::ByteSizeLong(this->options_);
      uVar7 = (uint)sVar5 | 1;
      iVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar9 = sVar9 + sVar5 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    uVar7 = (this->_has_bits_).has_bits_[0];
    if ((uVar7 & 0x40) != 0) {
      if (this->number_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar8 = this->number_ | 1;
        iVar4 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar6 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
      }
      sVar9 = sVar9 + uVar6;
    }
    if ((char)uVar7 < '\0') {
      if (this->oneof_index_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar7 = this->oneof_index_ | 1;
        iVar4 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar6 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
      }
      sVar9 = sVar9 + uVar6;
    }
  }
  uVar7 = (this->_has_bits_).has_bits_[0];
  if ((uVar7 & 0x300) != 0) {
    if ((uVar7 >> 8 & 1) != 0) {
      if (this->label_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar8 = this->label_ | 1;
        iVar4 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar6 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
      }
      sVar9 = sVar9 + uVar6;
    }
    if ((uVar7 >> 9 & 1) != 0) {
      if (this->type_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar7 = this->type_ | 1;
        iVar4 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar6 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
      }
      sVar9 = sVar9 + uVar6;
    }
  }
  this->_cached_size_ = (int)sVar9;
  return sVar9;
}

Assistant:

size_t FieldDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldDescriptorProto)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 255u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional string extendee = 2;
    if (has_extendee()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->extendee());
    }

    // optional string type_name = 6;
    if (has_type_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->type_name());
    }

    // optional string default_value = 7;
    if (has_default_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->default_value());
    }

    // optional string json_name = 10;
    if (has_json_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->json_name());
    }

    // optional .google.protobuf.FieldOptions options = 8;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->options_);
    }

    // optional int32 number = 3;
    if (has_number()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->number());
    }

    // optional int32 oneof_index = 9;
    if (has_oneof_index()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->oneof_index());
    }

  }
  if (_has_bits_[8 / 32] & 768u) {
    // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
    if (has_label()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->label());
    }

    // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
    if (has_type()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}